

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t uVar1;
  uint32_t uVar2;
  pointer pMVar3;
  bool bVar4;
  char cVar5;
  DiskType DVar6;
  int iVar7;
  int32_t num;
  double *i;
  ostream *poVar8;
  TSMuxer *this;
  TSMuxer *this_00;
  long lVar9;
  string *psVar10;
  undefined4 *puVar11;
  runtime_error *prVar12;
  BlurayHelper *fileFactory;
  ulong idx;
  pointer pdVar13;
  char *pcVar14;
  char **ppcVar15;
  string *psVar16;
  uint uVar17;
  int iVar18;
  bool insertBlankPL;
  char local_67e;
  allocator<char> local_67d;
  int local_67c;
  long local_678;
  char **local_670;
  string subItemName;
  string itemName;
  int blankNum;
  int firstM2tsOffset;
  int firstMplsOffset;
  IsoWriter *local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string fileExt_1;
  string isoDiskLabel;
  string fileExt2;
  string fileExt;
  vector<double,_std::allocator<double>_> customChapterList;
  int autoChapterLen;
  bool stereoMode;
  ulong local_4e8;
  long local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  undefined8 uStack_4c0;
  undefined1 *local_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  undefined8 uStack_4a0;
  string str;
  MPLSParser mplsParser;
  bool local_270;
  int64_t local_190;
  pointer local_158;
  pointer local_150;
  long local_e0;
  bool local_46;
  uint local_38;
  bool local_32;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"tsMuxeR version git-c6b1186");
  poVar8 = std::operator<<(poVar8,". github.com/justdan96/tsMuxer");
  std::endl<char,std::char_traits<char>>(poVar8);
  firstMplsOffset = 0;
  sLastMsg = true;
  firstM2tsOffset = 0;
  blankNum = 0x76c;
  insertBlankPL = false;
  local_67c = argc;
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,argv[1],(allocator<char> *)&mplsParser);
    extractFileExt(&fileExt_1,&str);
    strToLowerCase((string *)&mplsParser,&fileExt_1);
    std::__cxx11::string::operator=((string *)&fileExt_1,(string *)&mplsParser);
    std::__cxx11::string::~string((string *)&mplsParser);
    bVar4 = std::operator==(&fileExt_1,"mpls");
    if ((bVar4) || (bVar4 = std::operator==(&fileExt_1,"mpl"), bVar4)) {
      bVar4 = std::operator==(&fileExt_1,"mpl");
      MPLSParser::MPLSParser(&mplsParser);
      MPLSParser::parse(&mplsParser,argv[1]);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&isoDiskLabel,argv[1],(allocator<char> *)&fileExt2);
      getBlurayStreamDir(&fileExt,&isoDiskLabel);
      std::__cxx11::string::~string((string *)&isoDiskLabel);
      pcVar14 = ".m2ts";
      if (bVar4) {
        pcVar14 = ".MTS";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&isoDiskLabel,pcVar14,(allocator<char> *)&fileExt2);
      pcVar14 = ".ssif";
      if (bVar4) {
        pcVar14 = ".SIF";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileExt2,pcVar14,(allocator<char> *)&itemName);
      local_610 = (IsoWriter *)CONCAT71(local_610._1_7_,mplsParser.isDependStreamExist);
      if (mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        psVar16 = &(mplsParser.m_playItems.
                    super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                    super__Vector_impl_data._M_start)->fileName;
        std::operator+(&subItemName,&fileExt,psVar16);
        std::operator+(&itemName,&subItemName,&isoDiskLabel);
        std::__cxx11::string::~string((string *)&subItemName);
        bVar4 = fileExists(&itemName);
        if (bVar4) {
          if (((char)local_610 != '\0') &&
             (mplsParser.m_mvcFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              mplsParser.m_mvcFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            std::operator+(&local_608,&fileExt,
                           mplsParser.m_mvcFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
            std::operator+(&subItemName,&local_608,&isoDiskLabel);
            std::__cxx11::string::~string((string *)&local_608);
            bVar4 = fileExists(&subItemName);
            if (!bVar4) {
              std::__cxx11::string::~string((string *)&subItemName);
              goto LAB_001a8ead;
            }
            detectStreamReader(subItemName._M_dataplus._M_p,&mplsParser,true);
            goto LAB_001a8f83;
          }
        }
        else {
LAB_001a8ead:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stereoMode,"SSIF",&local_67d);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &autoChapterLen,&fileExt,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stereoMode);
          cVar5 = getDirSeparator();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &customChapterList,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &autoChapterLen,cVar5);
          std::operator+(&local_608,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &customChapterList,psVar16);
          std::operator+(&subItemName,&local_608,&fileExt2);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&customChapterList);
          std::__cxx11::string::~string((string *)&autoChapterLen);
          std::__cxx11::string::~string((string *)&stereoMode);
          bVar4 = fileExists(&subItemName);
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)&itemName);
          }
LAB_001a8f83:
          std::__cxx11::string::~string((string *)&subItemName);
        }
        detectStreamReader(itemName._M_dataplus._M_p,&mplsParser,false);
        std::__cxx11::string::~string((string *)&itemName);
      }
      pdVar13 = (pointer)0x0;
      local_678 = 0;
      local_670 = (char **)0x0;
      while( true ) {
        pMVar3 = mplsParser.m_playItems.
                 super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pointer)(((long)mplsParser.m_playItems.
                             super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)mplsParser.m_playItems.
                            super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x30) <= pdVar13) break;
        itemName._M_dataplus._M_p = (pointer)&itemName.field_2;
        itemName._M_string_length = 0;
        itemName.field_2._M_local_buf[0] = '\0';
        if ((char)local_610 == '\0') {
          psVar10 = (string *)std::__cxx11::string::append((string *)&fileExt);
          std::__cxx11::string::append(psVar10);
          std::__cxx11::string::_M_assign((string *)&itemName);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stereoMode,"SSIF",&local_67d);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &autoChapterLen,&fileExt,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stereoMode);
          cVar5 = getDirSeparator();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &customChapterList,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &autoChapterLen,cVar5);
          std::operator+(&local_608,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &customChapterList,&pMVar3[(long)pdVar13].fileName);
          std::operator+(&subItemName,&local_608,".ssif");
          std::__cxx11::string::operator=((string *)&itemName,(string *)&subItemName);
          std::__cxx11::string::~string((string *)&subItemName);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&customChapterList);
          std::__cxx11::string::~string((string *)&autoChapterLen);
          std::__cxx11::string::~string((string *)&stereoMode);
        }
        poVar8 = std::operator<<((ostream *)&std::cout,"");
        std::endl<char,std::char_traits<char>>(poVar8);
        sLastMsg = true;
        poVar8 = std::operator<<((ostream *)&std::cout,"File #");
        customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = pdVar13;
        int64ToStr_abi_cxx11_(&local_608,(int64_t *)&customChapterList);
        strPadLeft(&subItemName,&local_608,5,'0');
        poVar8 = std::operator<<(poVar8,(string *)&subItemName);
        poVar8 = std::operator<<(poVar8," name=");
        poVar8 = std::operator<<(poVar8,(string *)&itemName);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&subItemName);
        std::__cxx11::string::~string((string *)&local_608);
        sLastMsg = true;
        poVar8 = std::operator<<((ostream *)&std::cout,"Duration: ");
        floatToTime_abi_cxx11_
                  (&subItemName,
                   (double)(mplsParser.m_playItems.
                            super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)pdVar13].OUT_time -
                           mplsParser.m_playItems.
                           super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pdVar13].IN_time) / 45000.0,'.');
        poVar8 = std::operator<<(poVar8,(string *)&subItemName);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&subItemName);
        sLastMsg = true;
        if (mplsParser.isDependStreamExist == true) {
          pcVar14 = "Base view: left-eye";
          if (mplsParser.mvc_base_view_r != false) {
            pcVar14 = "Base view: right-eye";
          }
          poVar8 = std::operator<<((ostream *)&std::cout,pcVar14);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        sLastMsg = true;
        if (mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          poVar8 = std::operator<<((ostream *)&std::cout,"start-time: ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        iVar18 = 0;
        uVar17 = 0;
        ppcVar15 = local_670;
        while( true ) {
          sLastMsg = true;
          if (((char **)((long)mplsParser.m_marks.
                               super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)mplsParser.m_marks.
                               super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) <= ppcVar15) ||
             (pdVar13 < (pointer)(ulong)(uint)mplsParser.m_marks.
                                              super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(long)ppcVar15].m_playItemID)) break;
          uVar1 = mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)ppcVar15].m_markTime;
          uVar2 = mplsParser.m_playItems.
                  super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pdVar13].IN_time;
          if ((uVar17 / 5) * -5 == iVar18) {
            if (iVar18 != 0) {
              poVar8 = std::operator<<((ostream *)&std::cout,"");
              std::endl<char,std::char_traits<char>>(poVar8);
            }
            sLastMsg = true;
            std::operator<<((ostream *)&std::cout,"Marks: ");
          }
          sLastMsg = true;
          floatToTime_abi_cxx11_
                    (&subItemName,(double)(long)((ulong)(uVar1 - uVar2) + local_678) / 45000.0,'.');
          poVar8 = std::operator<<((ostream *)&std::cout,(string *)&subItemName);
          std::operator<<(poVar8," ");
          std::__cxx11::string::~string((string *)&subItemName);
          ppcVar15 = (char **)((long)ppcVar15 + 1);
          iVar18 = iVar18 + -1;
          uVar17 = uVar17 + 1;
        }
        local_670 = ppcVar15;
        if (iVar18 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cout,"");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        sLastMsg = true;
        local_678 = local_678 +
                    (ulong)(mplsParser.m_playItems.
                            super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)pdVar13].OUT_time -
                           mplsParser.m_playItems.
                           super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pdVar13].IN_time);
        std::__cxx11::string::~string((string *)&itemName);
        pdVar13 = (pointer)((long)pdVar13 + 1);
      }
      std::__cxx11::string::~string((string *)&fileExt2);
      std::__cxx11::string::~string((string *)&isoDiskLabel);
      std::__cxx11::string::~string((string *)&fileExt);
      MPLSParser::~MPLSParser(&mplsParser);
    }
    else {
      detectStreamReader(argv[1],(MPLSParser *)0x0,false);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&fileExt_1);
    psVar16 = &str;
    goto LAB_001a947e;
  }
  local_670 = argv;
  if (argc != 3) {
    showHelp();
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mplsParser,argv[2],(allocator<char> *)&str);
  extractFileExt(&fileExt,(string *)&mplsParser);
  std::__cxx11::string::~string((string *)&mplsParser);
  strToUpperCase((string *)&mplsParser,&fileExt);
  std::__cxx11::string::operator=((string *)&fileExt,(string *)&mplsParser);
  std::__cxx11::string::~string((string *)&mplsParser);
  local_4e0 = std::chrono::_V2::steady_clock::now();
  autoChapterLen = 0;
  customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  isoDiskLabel._M_dataplus._M_p = (pointer)&isoDiskLabel.field_2;
  isoDiskLabel._M_string_length = 0;
  stereoMode = false;
  isoDiskLabel.field_2._M_local_buf[0] = '\0';
  DVar6 = checkBluRayMux(local_670[1],&autoChapterLen,&customChapterList,&firstMplsOffset,
                         &firstM2tsOffset,&insertBlankPL,&blankNum,&stereoMode,&isoDiskLabel);
  local_678 = CONCAT44(local_678._4_4_,DVar6);
  unquoteStr(&fileExt2,&fileExt);
  bVar4 = std::operator==(&fileExt2,"M2TS");
  if (((bVar4) || (bVar4 = std::operator==(&fileExt2,"TS"), bVar4)) ||
     (bVar4 = std::operator==(&fileExt2,"SSIF"), bVar4)) {
LAB_001a86da:
    BlurayHelper::BlurayHelper((BlurayHelper *)&fileExt_1);
    MuxerManager::MuxerManager
              ((MuxerManager *)&mplsParser,&readManager,&tsMuxerFactory.super_AbstractMuxerFactory);
    bVar4 = std::operator==(&fileExt2,"SSIF");
    MuxerManager::setAllowStereoMux((MuxerManager *)&mplsParser,(DiskType)local_678 != 0 || bVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,local_670[1],(allocator<char> *)&itemName);
    MuxerManager::openMetaFile((MuxerManager *)&mplsParser,&str);
    std::__cxx11::string::~string((string *)&str);
    bVar4 = isV3();
    if (((DiskType)local_678 == 1 && !bVar4) && (local_270 == true)) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "HEVC stream detected: changing Blu-Ray version to V3.");
      std::endl<char,std::char_traits<char>>(poVar8);
      sLastMsg = true;
      V3_flags._0_1_ = (byte)V3_flags | 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,local_670[2],(allocator<char> *)&subItemName);
    unquoteStr(&itemName,&str);
    std::__cxx11::string::~string((string *)&str);
    bVar4 = isValidFileName(&itemName);
    if (!bVar4) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subItemName,"Output filename is invalid: ",(allocator<char> *)&local_608
                );
      std::operator+(&str,&subItemName,&itemName);
      std::runtime_error::runtime_error(prVar12,(string *)&str);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((DiskType)local_678 != 0) {
      iVar18 = BlurayHelper::open((BlurayHelper *)&fileExt_1,(char *)&itemName,(DiskType)local_678,
                                  local_190,(ulong)local_38,(ulong)local_32);
      if ((char)iVar18 == '\0') {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&subItemName,"Can\'t create output file ",(allocator<char> *)&local_608
                  );
        std::operator+(&str,&subItemName,&itemName);
        std::runtime_error::runtime_error(prVar12,(string *)&str);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      BlurayHelper::setVolumeLabel((BlurayHelper *)&fileExt_1,&isoDiskLabel);
      BlurayHelper::createBluRayDirs((BlurayHelper *)&fileExt_1);
      BlurayHelper::m2tsFileName_abi_cxx11_(&str,(BlurayHelper *)&fileExt_1,firstM2tsOffset);
      std::__cxx11::string::operator=((string *)&itemName,(string *)&str);
      std::__cxx11::string::~string((string *)&str);
    }
    if ((int)(((long)local_150 - (long)local_158) / 0x110) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      std::operator<<((ostream *)&str,"No tracks selected");
      puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar11 = 3;
      *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
      if (local_4b8 == &local_4a8) {
        *(ulong *)(puVar11 + 6) = CONCAT71(uStack_4a7,local_4a8);
        *(undefined8 *)(puVar11 + 8) = uStack_4a0;
      }
      else {
        *(undefined1 **)(puVar11 + 2) = local_4b8;
        *(ulong *)(puVar11 + 6) = CONCAT71(uStack_4a7,local_4a8);
      }
      *(undefined8 *)(puVar11 + 4) = local_4b0;
      local_4b0 = 0;
      local_4a8 = 0;
      local_4b8 = &local_4a8;
      __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    fileFactory = (BlurayHelper *)0x0;
    if ((DiskType)local_678 != 0) {
      fileFactory = (BlurayHelper *)&fileExt_1;
    }
    MuxerManager::doMux((MuxerManager *)&mplsParser,&itemName,&fileFactory->super_FileFactory);
    iVar18 = blankNum;
    if ((DiskType)local_678 != 0) {
      local_4e8 = (ulong)(uint)firstMplsOffset;
      local_67e = insertBlankPL;
      BlurayHelper::writeBluRayFiles
                ((BlurayHelper *)&fileExt_1,(MuxerManager *)&mplsParser,insertBlankPL,
                 firstMplsOffset,blankNum,stereoMode);
      this = (TSMuxer *)MuxerManager::getMainMuxer((MuxerManager *)&mplsParser);
      if ((this == (TSMuxer *)0x0) ||
         ((this->super_AbstractMuxer)._vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_0024c678))
      {
        this = (TSMuxer *)0x0;
      }
      this_00 = (TSMuxer *)MuxerManager::getSubMuxer((MuxerManager *)&mplsParser);
      if ((this_00 == (TSMuxer *)0x0) ||
         ((this_00->super_AbstractMuxer)._vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_0024c678
         )) {
        this_00 = (TSMuxer *)0x0;
      }
      if (this != (TSMuxer *)0x0) {
        iVar7 = TSMuxer::getFirstFileNum(this);
        BlurayHelper::createCLPIFile((BlurayHelper *)&fileExt_1,this,iVar7,true);
      }
      if (this_00 != (TSMuxer *)0x0) {
        iVar7 = TSMuxer::getFirstFileNum(this_00);
        BlurayHelper::createCLPIFile((BlurayHelper *)&fileExt_1,this_00,iVar7,false);
        local_610 = BlurayHelper::isoWriter((BlurayHelper *)&fileExt_1);
        if (local_610 != (IsoWriter *)0x0) {
          for (idx = 0; idx < (ulong)((long)(this->m_fileNames).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_fileNames).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5);
              idx = idx + 1) {
            TSMuxer::getFileNameByIdx_abi_cxx11_(&str,this,idx);
            TSMuxer::getFileNameByIdx_abi_cxx11_(&subItemName,this_00,idx);
            extractFileName(&local_608,&str);
            num = strToInt32(&local_608);
            std::__cxx11::string::~string((string *)&local_608);
            if ((str._M_string_length != 0) && (subItemName._M_string_length != 0)) {
              BlurayHelper::ssifFileName_abi_cxx11_(&local_608,(BlurayHelper *)&fileExt_1,num);
              IsoWriter::createInterleavedFile(local_610,&str,&subItemName,&local_608);
              std::__cxx11::string::~string((string *)&local_608);
            }
            std::__cxx11::string::~string((string *)&subItemName);
            std::__cxx11::string::~string((string *)&str);
          }
        }
      }
      for (pdVar13 = customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar13 !=
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
        *pdVar13 = *pdVar13 - (double)local_e0 / 5292000000.0;
      }
      if (this_00 != (TSMuxer *)0x0) {
        TSMuxer::alignPTS(this,this_00);
      }
      BlurayHelper::createMPLSFile
                ((BlurayHelper *)&fileExt_1,this,this_00,autoChapterLen,&customChapterList,
                 (DiskType)local_678,(int)local_4e8,local_46);
      if ((local_67e == '\x01' && this != (TSMuxer *)0x0) && this_00 == (TSMuxer *)0x0) {
        poVar8 = std::operator<<((ostream *)&std::cout,"Adding blank play list");
        std::endl<char,std::char_traits<char>>(poVar8);
        sLastMsg = true;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&subItemName,*local_670,(allocator<char> *)&local_608);
        extractFileDir(&str,&subItemName);
        muxBlankPL(&str,(BlurayHelper *)&fileExt_1,&(this->m_pmt).pidList,(DiskType)local_678,iVar18
                  );
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)&subItemName);
      }
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"Mux successful complete");
    std::endl<char,std::char_traits<char>>(poVar8);
    sLastMsg = true;
    std::__cxx11::string::~string((string *)&itemName);
    MuxerManager::~MuxerManager((MuxerManager *)&mplsParser);
    BlurayHelper::~BlurayHelper((BlurayHelper *)&fileExt_1);
    pcVar14 = "Muxing time: ";
  }
  else {
    bVar4 = std::operator==(&fileExt2,"ISO");
    if (((DiskType)local_678 != 0) || (bVar4)) goto LAB_001a86da;
    MuxerManager::MuxerManager
              ((MuxerManager *)&mplsParser,&readManager,
               &singleFileMuxerFactory.super_AbstractMuxerFactory);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,local_670[1],(allocator<char> *)&fileExt_1);
    MuxerManager::openMetaFile((MuxerManager *)&mplsParser,&str);
    std::__cxx11::string::~string((string *)&str);
    if ((int)(((long)local_150 - (long)local_158) / 0x110) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      std::operator<<((ostream *)&str,"No tracks selected");
      puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar11 = 3;
      *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
      if (local_4d8 == &local_4c8) {
        *(ulong *)(puVar11 + 6) = CONCAT71(uStack_4c7,local_4c8);
        *(undefined8 *)(puVar11 + 8) = uStack_4c0;
      }
      else {
        *(undefined1 **)(puVar11 + 2) = local_4d8;
        *(ulong *)(puVar11 + 6) = CONCAT71(uStack_4c7,local_4c8);
      }
      *(undefined8 *)(puVar11 + 4) = local_4d0;
      local_4d0 = 0;
      local_4c8 = 0;
      local_4d8 = &local_4c8;
      __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileExt_1,local_670[2],(allocator<char> *)&itemName);
    unquoteStr(&str,&fileExt_1);
    std::__cxx11::string::~string((string *)&fileExt_1);
    bVar4 = isValidFileName(&str);
    if (!bVar4) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&itemName,"Output filename is invalid: ",(allocator<char> *)&subItemName)
      ;
      std::operator+(&fileExt_1,&itemName,&str);
      std::runtime_error::runtime_error(prVar12,(string *)&fileExt_1);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    createDir(&str,true);
    MuxerManager::doMux((MuxerManager *)&mplsParser,&str,(FileFactory *)0x0);
    poVar8 = std::operator<<((ostream *)&std::cout,"Demux complete.");
    std::endl<char,std::char_traits<char>>(poVar8);
    sLastMsg = true;
    std::__cxx11::string::~string((string *)&str);
    MuxerManager::~MuxerManager((MuxerManager *)&mplsParser);
    pcVar14 = "Demuxing time: ";
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  lVar9 = lVar9 - local_4e0;
  std::operator<<((ostream *)&std::cout,pcVar14);
  sLastMsg = true;
  if (59999999999 < lVar9) {
    poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
    std::operator<<(poVar8," min ");
  }
  sLastMsg = true;
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar8 = std::operator<<(poVar8," sec");
  std::endl<char,std::char_traits<char>>(poVar8);
  sLastMsg = true;
  std::__cxx11::string::~string((string *)&fileExt2);
  std::__cxx11::string::~string((string *)&isoDiskLabel);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&customChapterList.super__Vector_base<double,_std::allocator<double>_>);
  psVar16 = &fileExt;
LAB_001a947e:
  std::__cxx11::string::~string((string *)psVar16);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
#ifdef _WIN32
    auto argvWide = CommandLineToArgvW(GetCommandLineW(), &argc);
    std::vector<std::string> argv_utf8;
    argv_utf8.reserve(static_cast<std::size_t>(argc));
    for (int i = 0; i < argc; ++i)
    {
        argv_utf8.emplace_back(toUtf8(argvWide[i]));
    }
    LocalFree(argvWide);
    std::vector<char*> argv_vec;
    argv_vec.reserve(argv_utf8.size());
    for (auto&& s : argv_utf8)
    {
        argv_vec.push_back(s.data());
    }
    argv = argv_vec.data();
#endif
    LTRACE(LT_INFO, 2, "tsMuxeR version " TSMUXER_VERSION << ". github.com/justdan96/tsMuxer");
    int firstMplsOffset = 0;
    int firstM2tsOffset = 0;
    int blankNum = 1900;
    bool insertBlankPL = false;
    // createBluRayDirs("c:/workshop/");

    // MPLSParser parser;
    // parser.parse("d:/hdtv/SHERLOCK_HOLMES/BDMV/PLAYLIST/00100.mpls");

    // CLPIParser parser;
    // parser.parse("h:/BDMV/CLIPINF/00000.clpi");
    // parser.parse("d:/workshop/test_orig_disk2/BDMV/CLIPINF/00003.clpi");

    // uint8_t moBuffer[1024];
    // MovieObject mo;
    // mo.parse("h:/BDMV/MovieObject.bdmv");
    // int moLen = mo.compose(moBuffer, sizeof(moBuffer));
    // file.write(moBuffer, moLen);

    try
    {
        if (argc == 2)
        {
            string str = argv[1];
            string fileExt = extractFileExt(str);
            fileExt = strToLowerCase(fileExt);
            if (fileExt == "mpls" || fileExt == "mpl")
            {
                bool shortExt = fileExt == "mpl";
                MPLSParser mplsParser;
                mplsParser.parse(argv[1]);
                string streamDir = getBlurayStreamDir(argv[1]);
                std::string mediaExt = shortExt ? ".MTS" : ".m2ts";
                std::string ssifExt = shortExt ? ".SIF" : ".ssif";
                bool mode3D = mplsParser.isDependStreamExist;
                bool switchToSsif = false;
                if (!mplsParser.m_playItems.empty())
                {
                    MPLSPlayItem& item = mplsParser.m_playItems[0];
                    string itemName = streamDir + item.fileName + mediaExt;
                    if (fileExists(itemName))
                    {
                        if (mode3D && !mplsParser.m_mvcFiles.empty())
                        {
                            string subItemName = streamDir + mplsParser.m_mvcFiles[0] + mediaExt;
                            if (fileExists(subItemName))
                                detectStreamReader(subItemName.c_str(), &mplsParser, true);
                            else
                                switchToSsif = true;
                        }
                    }
                    else
                    {
                        switchToSsif = true;
                    }
                    if (switchToSsif)
                    {
                        string ssifName = streamDir + string("SSIF") + getDirSeparator() + item.fileName + ssifExt;
                        if (fileExists(ssifName))
                            itemName = ssifName;  // if m2ts file absent then swith to ssif
                    }
                    detectStreamReader(itemName.c_str(), &mplsParser, false);
                }

                size_t markIndex = 0;
                int64_t prevFileOffset = 0;
                for (size_t i = 0; i < mplsParser.m_playItems.size(); i++)
                {
                    MPLSPlayItem& item = mplsParser.m_playItems[i];

                    string itemName;
                    if (mode3D)
                        itemName = streamDir + string("SSIF") + getDirSeparator() + item.fileName + ".ssif";
                    else
                        itemName = streamDir.append(item.fileName).append(mediaExt);  // 2d mode

                    LTRACE(LT_INFO, 2, "");
                    LTRACE(LT_INFO, 2, "File #" << strPadLeft(int64ToStr(i), 5, '0') << " name=" << itemName);
                    LTRACE(LT_INFO, 2,
                           "Duration: " << floatToTime(
                               (mplsParser.m_playItems[i].OUT_time - mplsParser.m_playItems[i].IN_time) /
                               (double)45000.0));
                    if (mplsParser.isDependStreamExist)
                    {
                        if (mplsParser.mvc_base_view_r)
                        {
                            LTRACE(LT_INFO, 2, "Base view: right-eye");
                        }
                        else
                        {
                            LTRACE(LT_INFO, 2, "Base view: left-eye");
                        }
                    }
                    if (!mplsParser.m_playItems.empty())
                        LTRACE(LT_INFO, 2, "start-time: " << mplsParser.m_playItems[0].IN_time);
                    int marksPerFile = 0;
                    for (; markIndex < mplsParser.m_marks.size(); markIndex++)
                    {
                        PlayListMark& curMark = mplsParser.m_marks[markIndex];
                        if (static_cast<unsigned>(curMark.m_playItemID) > i)
                            break;
                        uint64_t time = curMark.m_markTime - mplsParser.m_playItems[i].IN_time + prevFileOffset;
                        if (marksPerFile % 5 == 0)
                        {
                            if (marksPerFile > 0)
                                LTRACE(LT_INFO, 2, "");
                            LTRACE2(LT_INFO, "Marks: ")
                        }
                        marksPerFile++;
                        LTRACE2(LT_INFO, floatToTime((double)time / 45000.0) << " ")
                    }
                    if (marksPerFile > 0)
                        LTRACE(LT_INFO, 2, "");
                    prevFileOffset += mplsParser.m_playItems[i].OUT_time - mplsParser.m_playItems[i].IN_time;
                }
            }
            else
                detectStreamReader(argv[1], nullptr, false);
            cout << endl;
            return 0;
        }
        if (argc != 3)
        {
            /*
                        LTRACE(LT_INFO, 2, "Usage: ");
                        LTRACE(LT_INFO, 2, "For start muxing: " << "tsMuxeR <meta file name> <out file/dir name>");
                        LTRACE(LT_INFO, 2, "For detect stream params: " << "tsMuxeR <media file name>");
                        LTRACE(LT_INFO, 2, "For more information about meta file see readme.txt");
                        cout << endl;
            */
            showHelp();
            return -1;
        }
        string fileExt = extractFileExt(argv[2]);
        fileExt = strToUpperCase(fileExt);
        auto startTime = std::chrono::steady_clock::now();

        int autoChapterLen = 0;
        vector<double> customChapterList;
        bool stereoMode = false;
        string isoDiskLabel;
        DiskType dt = checkBluRayMux(argv[1], autoChapterLen, customChapterList, firstMplsOffset, firstM2tsOffset,
                                     insertBlankPL, blankNum, stereoMode, isoDiskLabel);
        std::string fileExt2 = unquoteStr(fileExt);
        bool muxMode =
            fileExt2 == "M2TS" || fileExt2 == "TS" || fileExt2 == "SSIF" || fileExt2 == "ISO" || dt != DiskType::NONE;

        if (muxMode)
        {
            BlurayHelper blurayHelper;

            MuxerManager muxerManager(readManager, tsMuxerFactory);
            muxerManager.setAllowStereoMux(fileExt2 == "SSIF" || dt != DiskType::NONE);
            muxerManager.openMetaFile(argv[1]);
            if (!isV3() && dt == DiskType::BLURAY && muxerManager.getHevcFound())
            {
                LTRACE(LT_INFO, 2, "HEVC stream detected: changing Blu-Ray version to V3.");
                V3_flags |= HDMV_V3;
            }

            // output path - is checked for invalid characters on our platform
            string dstFile = unquoteStr(argv[2]);

            if (!isValidFileName(dstFile))
                throw runtime_error(string("Output filename is invalid: ") + dstFile);

            if (dt != DiskType::NONE)
            {
                if (!blurayHelper.open(dstFile, dt, muxerManager.totalSize(), muxerManager.getExtraISOBlocks(),
                                       muxerManager.useReproducibleIsoHeader()))
                    throw runtime_error(string("Can't create output file ") + dstFile);
                blurayHelper.setVolumeLabel(isoDiskLabel);
                blurayHelper.createBluRayDirs();
                dstFile = blurayHelper.m2tsFileName(firstM2tsOffset);
            }
            if (muxerManager.getTrackCnt() == 0)
                THROW(ERR_COMMON, "No tracks selected")
            muxerManager.doMux(dstFile, dt != DiskType::NONE ? &blurayHelper : nullptr);
            if (dt != DiskType::NONE)
            {
                blurayHelper.writeBluRayFiles(muxerManager, insertBlankPL, firstMplsOffset, blankNum, stereoMode);
                auto mainMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());
                auto subMuxer = dynamic_cast<TSMuxer*>(muxerManager.getSubMuxer());

                if (mainMuxer)
                    blurayHelper.createCLPIFile(mainMuxer, mainMuxer->getFirstFileNum(), true);
                if (subMuxer)
                {
                    blurayHelper.createCLPIFile(subMuxer, subMuxer->getFirstFileNum(), false);

                    IsoWriter* IsoWriter = blurayHelper.isoWriter();
                    if (IsoWriter)
                    {
                        for (size_t i = 0; i < mainMuxer->splitFileCnt(); ++i)
                        {
                            string file1 = mainMuxer->getFileNameByIdx(i);
                            string file2 = subMuxer->getFileNameByIdx(i);
                            int ssifNum = strToInt32(extractFileName(file1));
                            if (!file1.empty() && !file2.empty())
                                IsoWriter->createInterleavedFile(file1, file2, blurayHelper.ssifFileName(ssifNum));
                        }
                    }
                }

                for (auto& i : customChapterList)
                    i -= static_cast<double>(muxerManager.getCutStart()) / INTERNAL_PTS_FREQ;

                if (subMuxer)
                    mainMuxer->alignPTS(subMuxer);

                blurayHelper.createMPLSFile(mainMuxer, subMuxer, autoChapterLen, customChapterList, dt, firstMplsOffset,
                                            muxerManager.isMvcBaseViewR());

                if (insertBlankPL && mainMuxer && !subMuxer)
                {
                    LTRACE(LT_INFO, 2, "Adding blank play list");
                    muxBlankPL(extractFileDir(argv[0]), blurayHelper, mainMuxer->getPidList(), dt, blankNum);
                }
            }

            LTRACE(LT_INFO, 2, "Mux successful complete");
        }
        else
        {
            MuxerManager sMuxer(readManager, singleFileMuxerFactory);
            sMuxer.openMetaFile(argv[1]);
            if (sMuxer.getTrackCnt() == 0)
                THROW(ERR_COMMON, "No tracks selected")

            // output path - is checked for invalid characters on our platform
            string dstFile = unquoteStr(argv[2]);

            if (!isValidFileName(dstFile))
                throw runtime_error(string("Output filename is invalid: ") + dstFile);

            createDir(dstFile, true);
            sMuxer.doMux(dstFile, nullptr);
            LTRACE(LT_INFO, 2, "Demux complete.");
        }
        auto endTime = std::chrono::steady_clock::now();
        auto totalTime = endTime - startTime;
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(totalTime);
        auto minutes = std::chrono::duration_cast<std::chrono::minutes>(totalTime);
        if (muxMode)
        {
            LTRACE2(LT_INFO, "Muxing time: ")
        }
        else
            LTRACE2(LT_INFO, "Demuxing time: ")
        if (minutes.count() > 0)
        {
            LTRACE2(LT_INFO, minutes.count() << " min ")
            seconds -= minutes;
        }
        LTRACE(LT_INFO, 2, seconds.count() << " sec");

        return 0;
    }
    catch (runtime_error& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE2(LT_ERROR, e.what())
        return -1;
    }
    catch (VodCoreException& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, e.m_errStr.c_str());
        return -2;
    }
    catch (BitStreamException& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, "Bitstream exception " << e.what() << EXCEPTION_ERR_MSG);
        return -3;
    }
    catch (...)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, "Unknnown exception" << EXCEPTION_ERR_MSG);
        return -4;
    }
}